

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_dsp.c
# Opt level: O2

void SharpYuvFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  uint16_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar10 = ~(-1 << ((byte)bit_depth & 0x1f));
  uVar6 = (ulong)(uint)len;
  if (len < 1) {
    uVar6 = 0;
  }
  for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    sVar1 = A[uVar9];
    sVar2 = A[uVar9 + 1];
    sVar3 = B[uVar9];
    sVar4 = B[uVar9 + 1];
    uVar8 = (uint)best_y[uVar9 * 2] +
            (sVar1 * 9 + (int)sVar4 + ((int)sVar3 + (int)sVar2) * 3 + 8 >> 4);
    uVar5 = uVar10;
    if ((int)uVar8 < (int)uVar10) {
      uVar5 = uVar8;
    }
    uVar7 = (uint16_t)uVar5;
    if ((int)uVar8 < 0) {
      uVar7 = 0;
    }
    out[uVar9 * 2] = uVar7;
    uVar8 = (uint)best_y[uVar9 * 2 + 1] +
            (((int)sVar4 + (int)sVar1) * 3 + sVar2 * 9 + (int)sVar3 + 8 >> 4);
    uVar5 = uVar10;
    if ((int)uVar8 < (int)uVar10) {
      uVar5 = uVar8;
    }
    uVar7 = (uint16_t)uVar5;
    if ((int)uVar8 < 0) {
      uVar7 = 0;
    }
    out[uVar9 * 2 + 1] = uVar7;
  }
  return;
}

Assistant:

static void SharpYuvFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out,
                                int bit_depth) {
  int i;
  const int max_y = (1 << bit_depth) - 1;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip(best_y[2 * i + 0] + v0, max_y);
    out[2 * i + 1] = clip(best_y[2 * i + 1] + v1, max_y);
  }
}